

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_spi.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::SPIFailureChecker::GetResult
          (AssertionResult *__return_storage_ptr__,SPIFailureChecker *this,string *substr)

{
  TestPartResult *value;
  char *pcVar1;
  AssertionResult *pAVar2;
  long lVar3;
  AssertionResult *ar;
  size_t i;
  ulong uVar4;
  char *expected;
  size_t num;
  AssertionResult local_48;
  
  expected = "1 non-fatal failure";
  if (this->m_Type == kFatalFailure) {
    expected = "1 fatal failure";
  }
  value = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
          _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)value;
  num = lVar3 / 0x30;
  if (lVar3 == 0x30) {
    if (*(Type *)&(value->super_iuCodeMessage).field_0x2c == this->m_Type) {
      pcVar1 = strstr((value->super_iuCodeMessage).m_message._M_dataplus._M_p,
                      (substr->_M_dataplus)._M_p);
      if (pcVar1 != (char *)0x0) {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_string_length = 0;
        (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->m_result = true;
        return __return_storage_ptr__;
      }
      local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
      local_48.m_message._M_string_length = 0;
      local_48.m_message.field_2._M_local_buf[0] = '\0';
      local_48.m_result = false;
      pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expected);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [14])" containing \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,substr);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [13])"\"\n  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,value);
      AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    }
    else {
      local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
      local_48.m_message._M_string_length = 0;
      local_48.m_message.field_2._M_local_buf[0] = '\0';
      local_48.m_result = false;
      pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expected);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [13])"\"\n  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,value);
      AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
    local_48.m_message._M_string_length = 0;
    local_48.m_message.field_2._M_local_buf[0] = '\0';
    local_48.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expected);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&num);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])" failures\n");
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_48);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < num; uVar4 = uVar4 + 1) {
      AssertionResult::operator<<
                (__return_storage_ptr__,
                 (TestPartResult *)
                 ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).
                           m_results.
                           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).
                         m_message._M_dataplus + lVar3));
      lVar3 = lVar3 + 0x30;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(const ::std::string& substr)
    {
        const char* expected =
            (m_Type == TestPartResult::kFatalFailure) ? "1 fatal failure" : "1 non-fatal failure";
        const size_t num = count();
        if( num != 1 )
        {
            AssertionResult ar = AssertionFailure() << "error: Expected: " << expected
                << "\n  Actual: " << num << " failures\n";
            for( size_t i=0; i < num; ++i )
            {
                ar << GetTestPartResult(i);
            }
            return ar;
        }

        const TestPartResult& tr = GetTestPartResult(0);
        if( tr.type() != m_Type )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << "\"\n  Actual:\n" << tr;
        }

        if( strstr(tr.message(), substr.c_str()) == NULL )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << " containing \"" << substr
                << "\"\n  Actual:\n" << tr;
        }
        return AssertionSuccess();
    }